

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeDeviceGet
          (ze_driver_handle_t hDriver,uint32_t *pCount,ze_device_handle_t *phDevices)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  ze_result_t zVar7;
  ze_result_t result;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  ze_result_t local_9c;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = context;
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeDeviceGet(hDriver, pCount, phDevices)","");
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(lVar6 + 0xe8);
  if (pcVar3 == (code *)0x0) {
    zVar7 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(lVar6 + 0xd30);
    lVar4 = *(long *)(lVar6 + 0xd38);
    uVar9 = lVar4 - lVar2 >> 3;
    bVar10 = lVar4 != lVar2;
    if (bVar10) {
      uVar8 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(lVar6 + 0xd30) + -8 + uVar8 * 8);
        zVar7 = (**(code **)(*plVar5 + 0x90))(plVar5,hDriver,pCount,phDevices);
        if (zVar7 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeDeviceGet",zVar7);
          local_9c = zVar7;
          break;
        }
        bVar10 = uVar8 < uVar9;
        lVar1 = (-(ulong)(uVar9 == 0) - uVar9) + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar1 != 0);
    }
    if (bVar10) {
      return local_9c;
    }
    if ((*(char *)(lVar6 + 4) == '\x01') &&
       (zVar7 = ZEHandleLifetimeValidation::zeDeviceGetPrologue
                          (*(ZEHandleLifetimeValidation **)(lVar6 + 0xd48),hDriver,pCount,phDevices)
       , zVar7 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeDeviceGet",zVar7);
      return zVar7;
    }
    zVar7 = (*pcVar3)(hDriver,pCount,phDevices);
    bVar10 = lVar4 != lVar2;
    if (bVar10) {
      uVar8 = 1;
      do {
        plVar5 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        result = (**(code **)(*plVar5 + 0x98))(plVar5,hDriver,pCount,phDevices,zVar7);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeDeviceGet",result);
          local_9c = result;
          break;
        }
        bVar10 = uVar8 < uVar9;
        lVar2 = (-(ulong)(uVar9 == 0) - uVar9) + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar2 != 0);
    }
    lVar2 = context;
    if (bVar10) {
      return local_9c;
    }
    if (((zVar7 == ZE_RESULT_SUCCESS) && (*(char *)(context + 4) == '\x01')) &&
       (phDevices != (ze_device_handle_t *)0x0)) {
      uVar9 = 0;
      do {
        if (*pCount <= uVar9) break;
        if (phDevices[uVar9] != (ze_device_handle_t)0x0) {
          HandleLifetimeValidation::addHandle
                    (*(HandleLifetimeValidation **)(lVar2 + 0xd48),phDevices[uVar9]);
          HandleLifetimeValidation::addDependent
                    (*(HandleLifetimeValidation **)(lVar2 + 0xd48),hDriver,phDevices[uVar9]);
        }
        uVar9 = uVar9 + 1;
      } while (phDevices != (ze_device_handle_t *)0x0);
    }
  }
  logAndPropagateResult("zeDeviceGet",zVar7);
  return zVar7;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGet(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of devices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of devices available.
                                                        ///< if count is greater than the number of devices available, then the
                                                        ///< driver shall update the value with the correct number of devices available.
        ze_device_handle_t* phDevices                   ///< [in,out][optional][range(0, *pCount)] array of handle of devices.
                                                        ///< if count is less than the number of devices available, then driver
                                                        ///< shall only retrieve that number of devices.
        )
    {
        context.logger->log_trace("zeDeviceGet(hDriver, pCount, phDevices)");

        auto pfnGet = context.zeDdiTable.Device.pfnGet;

        if( nullptr == pfnGet )
            return logAndPropagateResult("zeDeviceGet", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDeviceGetPrologue( hDriver, pCount, phDevices );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGet", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeDeviceGetPrologue( hDriver, pCount, phDevices );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGet", result);
        }

        auto driver_result = pfnGet( hDriver, pCount, phDevices );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDeviceGetEpilogue( hDriver, pCount, phDevices ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGet", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            for (size_t i = 0; ( nullptr != phDevices) && (i < *pCount); ++i){
                if (phDevices[i]){
                    context.handleLifetime->addHandle( phDevices[i] );
                    context.handleLifetime->addDependent( hDriver, phDevices[i] );
                }
            }
        }
        return logAndPropagateResult("zeDeviceGet", driver_result);
    }